

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O1

void Aig_ManCounterExampleValueTest(Aig_Man_t *pAig,Abc_Cex_t *pCex)

{
  uint Id;
  Vec_Ptr_t *pVVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  
  pVVar1 = pAig->vObjs;
  if (pVVar1 == (Vec_Ptr_t *)0x0) {
    pvVar4 = (void *)0x0;
  }
  else {
    if (pVVar1->nSize < 1) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    pvVar4 = pVVar1->pArray[(uint)(pVVar1->nSize / 2)];
  }
  iVar3 = 1;
  if (1 < pCex->iFrame) {
    iVar3 = pCex->iFrame;
  }
  printf("\nUsing counter-example, which asserts output %d in frame %d.\n",(ulong)(uint)pCex->iPo);
  Aig_ManCounterExampleValueStart(pAig,pCex);
  Id = *(uint *)((long)pvVar4 + 0x24);
  uVar2 = Aig_ManCounterExampleValueLookup(pAig,Id,iVar3 - 1U);
  printf("Value of object %d in frame %d is %d.\n",(ulong)Id,(ulong)(iVar3 - 1U),(ulong)uVar2);
  Aig_ManCounterExampleValueStop(pAig);
  return;
}

Assistant:

void Aig_ManCounterExampleValueTest( Aig_Man_t * pAig, Abc_Cex_t * pCex )
{
    Aig_Obj_t * pObj = Aig_ManObj( pAig, Aig_ManObjNumMax(pAig)/2 );
    int iFrame = Abc_MaxInt( 0, pCex->iFrame - 1 );
    printf( "\nUsing counter-example, which asserts output %d in frame %d.\n", pCex->iPo, pCex->iFrame );
    Aig_ManCounterExampleValueStart( pAig, pCex );
    printf( "Value of object %d in frame %d is %d.\n", Aig_ObjId(pObj), iFrame,
        Aig_ManCounterExampleValueLookup(pAig, Aig_ObjId(pObj), iFrame) );
    Aig_ManCounterExampleValueStop( pAig );
}